

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O3

void __thiscall FTextureManager::AddGroup(FTextureManager *this,int wadnum,int ns,int usetype)

{
  int lump;
  int iVar1;
  int iVar2;
  uint uVar3;
  FString Name;
  FString local_40;
  int local_34;
  
  local_34 = usetype;
  lump = FWadCollection::GetFirstLump(&Wads,wadnum);
  iVar1 = FWadCollection::GetLastLump(&Wads,wadnum);
  local_40.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if (lump <= iVar1) {
    do {
      iVar2 = FWadCollection::GetLumpNamespace(&Wads,lump);
      if (iVar2 == ns) {
        FWadCollection::GetLumpName(&Wads,&local_40,lump);
        iVar2 = FWadCollection::CheckNumForName(&Wads,local_40.Chars,ns);
        if (lump == iVar2) {
LAB_0065fe27:
          CreateTexture(this,lump,local_34);
        }
LAB_0065fe36:
        (*StartScreen->_vptr_FStartupScreen[2])();
      }
      else if ((ns == 2) && (uVar3 = FWadCollection::GetLumpFlags(&Wads,lump), (uVar3 & 1) != 0)) {
        iVar2 = FWadCollection::CheckNumForName(&Wads,local_40.Chars,2);
        if (iVar2 < lump) goto LAB_0065fe27;
        goto LAB_0065fe36;
      }
      lump = lump + 1;
    } while (iVar1 + 1 != lump);
  }
  FString::~FString(&local_40);
  return;
}

Assistant:

void FTextureManager::AddGroup(int wadnum, int ns, int usetype)
{
	int firsttx = Wads.GetFirstLump(wadnum);
	int lasttx = Wads.GetLastLump(wadnum);
	FString Name;

	// Go from first to last so that ANIMDEFS work as expected. However,
	// to avoid duplicates (and to keep earlier entries from overriding
	// later ones), the texture is only inserted if it is the one returned
	// by doing a check by name in the list of wads.

	for (; firsttx <= lasttx; ++firsttx)
	{
		if (Wads.GetLumpNamespace(firsttx) == ns)
		{
			Wads.GetLumpName (Name, firsttx);

			if (Wads.CheckNumForName (Name, ns) == firsttx)
			{
				CreateTexture (firsttx, usetype);
			}
			StartScreen->Progress();
		}
		else if (ns == ns_flats && Wads.GetLumpFlags(firsttx) & LUMPF_MAYBEFLAT)
		{
			if (Wads.CheckNumForName (Name, ns) < firsttx)
			{
				CreateTexture (firsttx, usetype);
			}
			StartScreen->Progress();
		}
	}
}